

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

int __thiscall despot::EvalLog::GetNumCompletedRuns(EvalLog *this,string *instance)

{
  pointer pbVar1;
  ulong uVar2;
  __type_conflict _Var3;
  int i;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    pbVar1 = (this->runned_instances).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->runned_instances).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4) {
      return 0;
    }
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar5),instance);
    lVar5 = lVar5 + 0x20;
    uVar2 = uVar4 + 1;
  } while (!_Var3);
  return (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar4];
}

Assistant:

int EvalLog::GetNumCompletedRuns(string instance) const {
	for (int i = 0; i < runned_instances.size(); i++) {
		if (runned_instances[i] == instance)
			return num_of_completed_runs[i];
	}
	return 0;
}